

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinTrace
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  const_reference pvVar1;
  ostream *poVar2;
  undefined8 uVar3;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  string *in_RSI;
  long in_RDI;
  string str;
  stringstream ss;
  string *in_stack_fffffffffffffd88;
  LocationRange *in_stack_fffffffffffffd90;
  Interpreter *in_stack_fffffffffffffd98;
  UString *in_stack_fffffffffffffda8;
  string local_218 [4];
  Type in_stack_fffffffffffffdec;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](in_RDX,0);
  if (pvVar1->t != STRING) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,
                             "Builtin function trace expected string as first parameter but ");
    poVar2 = std::operator<<(poVar2,"got ");
    std::
    vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
    ::operator[](local_18,0);
    (anonymous_namespace)::type_str_abi_cxx11_(in_stack_fffffffffffffdec);
    std::operator<<(poVar2,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    uVar3 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    makeError(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    __cxa_throw(uVar3,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  ::operator[](local_18,0);
  encode_utf8(in_stack_fffffffffffffda8);
  poVar2 = std::operator<<((ostream *)&std::cerr,"TRACE: ");
  poVar2 = std::operator<<(poVar2,local_10);
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ulong *)(local_10 + 0x20));
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,local_218);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_18,1);
  *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)pvVar1;
  *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = pvVar1->v;
  std::__cxx11::string::~string(local_218);
  return (AST *)0x0;
}

Assistant:

const AST *builtinTrace(const LocationRange &loc, const std::vector<Value> &args)
    {
        if(args[0].t != Value::STRING) {
            std::stringstream ss;
            ss << "Builtin function trace expected string as first parameter but "
               << "got " << type_str(args[0].t);
            throw makeError(loc, ss.str());
        }

        std::string str = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);
        std::cerr << "TRACE: " << loc.file << ":" << loc.begin.line << " " <<  str
            << std::endl;

        scratch = args[1];
        return nullptr;
    }